

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_integer_points_kd_tree_encoder.h
# Opt level: O0

void __thiscall
draco::DynamicIntegerPointsKdTreeEncoder<6>::
EncodeInternal<draco::PointDVector<unsigned_int>::PointDVectorIterator>
          (DynamicIntegerPointsKdTreeEncoder<6> *this,PointDVectorIterator begin,
          PointDVectorIterator end)

{
  PointDVectorIterator begin_;
  PointDVectorIterator end_;
  PointDVectorIterator end__00;
  PointDVectorIterator end__01;
  Splitter __pred;
  PointDVectorIterator __first;
  PointDVectorIterator __last;
  PointDVectorIterator begin_00;
  PointDVectorIterator end_00;
  PointDVectorIterator begin__00;
  PointDVectorIterator begin__01;
  undefined1 uVar1;
  uint32_t uVar2;
  reference pvVar3;
  const_reference pvVar4;
  size_t sVar5;
  reference pvVar6;
  reference pvVar7;
  size_t sVar8;
  value_type *in_RDI;
  value_type *in_stack_00000008;
  DynamicIntegerPointsKdTreeEncoder<6> *in_stack_00000010;
  undefined8 in_stack_00000018;
  DirectBitEncoder *in_stack_00000020;
  PointDVector<unsigned_int> *in_stack_00000028;
  uint32_t uStack0000000000000030;
  undefined4 uStack0000000000000034;
  bool left;
  uint32_t second_half;
  uint32_t first_half;
  int required_bits;
  PointDVectorIterator split;
  VectorUint32 *new_base;
  uint32_t modifier;
  uint32_t num_remaining_bits;
  uint32_t num_remaining_bits_1;
  uint32_t j;
  PseudoPointD<unsigned_int> *p;
  uint32_t i_1;
  uint32_t i;
  uint32_t num_remaining_points;
  uint32_t level;
  uint32_t axis;
  VectorUint32 *levels;
  VectorUint32 *old_base;
  uint32_t stack_pos;
  uint32_t last_axis;
  Status status;
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  status_stack;
  Status init_status;
  value_type *pvVar9;
  int iVar10;
  DynamicIntegerPointsKdTreeEncoder<6> *pDVar11;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *this_00;
  allocator_type *in_stack_fffffffffffffb58;
  undefined8 uVar12;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb60;
  DirectBitEncoder *this_01;
  size_type in_stack_fffffffffffffb68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffb70;
  undefined1 in_stack_fffffffffffffb78 [14];
  undefined1 in_stack_fffffffffffffb86;
  undefined1 in_stack_fffffffffffffb87;
  undefined8 in_stack_fffffffffffffb88;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *this_02;
  uint32_t in_stack_fffffffffffffbc0;
  uint32_t in_stack_fffffffffffffbc4;
  PseudoPointD<unsigned_int> *in_stack_fffffffffffffbc8;
  VectorUint32 *in_stack_fffffffffffffbd0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffbd8;
  undefined4 in_stack_fffffffffffffbe0;
  value_type in_stack_fffffffffffffbe4;
  value_type in_stack_fffffffffffffbe8;
  value_type in_stack_fffffffffffffbec;
  uint32_t in_stack_fffffffffffffbf0;
  uint32_t in_stack_fffffffffffffbf4;
  undefined7 in_stack_fffffffffffffc00;
  undefined1 *puVar13;
  undefined4 in_stack_fffffffffffffc10;
  undefined4 uVar14;
  undefined1 *puVar15;
  Splitter local_290 [5];
  value_type *local_268;
  DynamicIntegerPointsKdTreeEncoder<6> *pDStack_260;
  PointDVectorIterator local_248;
  reference local_230;
  int local_228;
  int local_224;
  ulong local_220;
  uint32_t local_214;
  uint local_210;
  uint local_20c;
  PseudoPointD<unsigned_int> local_1f0;
  PseudoPointD<unsigned_int> *local_1e0;
  uint local_1d8;
  uint local_1d4;
  uint local_1d0;
  value_type local_1cc;
  uint32_t local_184;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_180;
  reference local_178;
  uint local_170;
  undefined4 local_16c;
  PointDVectorIterator local_168;
  PointDVectorIterator PStack_150;
  undefined8 local_138;
  ulong uStack_130;
  undefined1 local_128 [212];
  undefined4 local_54;
  undefined1 local_50 [44];
  undefined4 local_24;
  
  local_24 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x22921a);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (value_type_conflict5 *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)(in_RDI + 0x1fc),0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffb60,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb60);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x22928b);
  local_54 = 0;
  std::allocator<unsigned_int>::allocator((allocator<unsigned_int> *)0x2292be);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
             (value_type_conflict5 *)in_stack_fffffffffffffb60,in_stack_fffffffffffffb58);
  uVar14 = 0;
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                *)(in_RDI + 0x202),0);
  puVar13 = local_50;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
            (in_stack_fffffffffffffb60,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_fffffffffffffb58);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_stack_fffffffffffffb60);
  std::allocator<unsigned_int>::~allocator((allocator<unsigned_int> *)0x229336);
  begin__00.vec_ = in_stack_00000028;
  begin__00.item_ = (size_t)in_stack_00000020;
  begin__00.dimensionality_ = uStack0000000000000030;
  begin__00._20_4_ = uStack0000000000000034;
  end_.vec_._6_1_ = in_stack_fffffffffffffb86;
  end_._0_14_ = in_stack_fffffffffffffb78;
  end_.vec_._7_1_ = in_stack_fffffffffffffb87;
  end_._16_8_ = in_stack_fffffffffffffb88;
  pvVar9 = in_stack_00000008;
  pDVar11 = in_stack_00000010;
  EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
            ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
             in_stack_00000010,begin__00,end_,(uint32_t)((ulong)in_stack_00000008 >> 0x20),
             (uint32_t)in_stack_00000008);
  puVar15 = local_128;
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>>
  ::
  stack<std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>>>,void>
            ((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
              *)pDVar11);
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          *)pDVar11,pvVar9);
  while (uVar1 = std::
                 stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                 ::empty((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                          *)0x2293ff), ((uVar1 ^ 0xff) & 1) != 0) {
    pvVar3 = std::
             stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
             ::top((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                    *)0x229427);
    local_168.item_ = (pvVar3->begin).item_;
    local_168.vec_ = (pvVar3->begin).vec_;
    local_168.dimensionality_ = (pvVar3->begin).dimensionality_;
    local_168._20_4_ = *(undefined4 *)&(pvVar3->begin).field_0x14;
    PStack_150.item_ = (pvVar3->end).item_;
    PStack_150.vec_ = (pvVar3->end).vec_;
    PStack_150.dimensionality_ = (pvVar3->end).dimensionality_;
    PStack_150._20_4_ = *(undefined4 *)&(pvVar3->end).field_0x14;
    local_138._0_4_ = pvVar3->last_axis;
    local_138._4_4_ = pvVar3->num_remaining_points;
    uStack_130 = *(ulong *)&pvVar3->stack_pos;
    std::
    stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
    ::pop((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
           *)0x229475);
    PointDVector<unsigned_int>::PointDVectorIterator::operator=
              ((PointDVectorIterator *)&stack0x00000008,&local_168);
    PointDVector<unsigned_int>::PointDVectorIterator::operator=
              ((PointDVectorIterator *)&stack0x00000020,&PStack_150);
    local_16c = (undefined4)local_138;
    local_170 = (uint)uStack_130;
    local_178 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x1fc),uStack_130 & 0xffffffff);
    local_180 = std::
                vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                              *)(in_RDI + 0x202),(ulong)local_170);
    begin_00.item_._4_4_ = in_stack_fffffffffffffbf4;
    begin_00.item_._0_4_ = in_stack_fffffffffffffbf0;
    begin_00.vec_ = (PointDVector<unsigned_int> *)pvVar3;
    begin_00._16_7_ = in_stack_fffffffffffffc00;
    begin_00._23_1_ = uVar1;
    end_00.vec_._0_4_ = in_stack_fffffffffffffc10;
    end_00.item_ = (size_t)puVar13;
    end_00.vec_._4_4_ = uVar14;
    end_00._16_8_ = puVar15;
    pvVar9 = in_stack_00000008;
    pDVar11 = in_stack_00000010;
    uVar12 = in_stack_00000018;
    this_01 = in_stack_00000020;
    in_stack_fffffffffffffbf4 =
         GetAndEncodeAxis<draco::PointDVector<unsigned_int>::PointDVectorIterator>
                   ((DynamicIntegerPointsKdTreeEncoder<6> *)
                    CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),begin_00,end_00,
                    in_stack_fffffffffffffbd8,in_stack_fffffffffffffbd0,
                    (uint32_t)((ulong)in_stack_fffffffffffffbc8 >> 0x20));
    local_184 = in_stack_fffffffffffffbf4;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_180,(ulong)in_stack_fffffffffffffbf4);
    local_1cc = *pvVar4;
    sVar5 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                      ((PointDVectorIterator *)&stack0x00000020,
                       (PointDVectorIterator *)&stack0x00000008);
    local_1d0 = (uint)sVar5;
    if (*in_RDI != local_1cc) {
      if (local_1d0 < 3) {
        in_stack_fffffffffffffbf0 = local_184;
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)(in_RDI + 0x1f6),
                            0);
        *pvVar6 = in_stack_fffffffffffffbf0;
        for (local_1d4 = 1; local_1d4 < in_RDI[2]; local_1d4 = local_1d4 + 1) {
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (in_RDI + 0x1f6),(ulong)(local_1d4 - 1));
          if (*pvVar6 == in_RDI[2] - 1) {
            in_stack_fffffffffffffbe8 = 0;
          }
          else {
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (in_RDI + 0x1f6),(ulong)(local_1d4 - 1));
            in_stack_fffffffffffffbe8 = *pvVar6 + 1;
          }
          in_stack_fffffffffffffbec = in_stack_fffffffffffffbe8;
          pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                             ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                              (in_RDI + 0x1f6),(ulong)local_1d4);
          *pvVar6 = in_stack_fffffffffffffbe8;
        }
        for (local_1d8 = 0; local_1d8 < local_1d0; local_1d8 = local_1d8 + 1) {
          local_20c = local_1d8;
          PointDVector<unsigned_int>::PointDVectorIterator::operator+
                    ((PointDVectorIterator *)pDVar11,(int32_t *)pvVar9);
          PointDVector<unsigned_int>::PointDVectorIterator::operator*(&pvVar9->begin);
          local_1e0 = &local_1f0;
          for (local_210 = 0; local_210 < in_RDI[2]; local_210 = local_210 + 1) {
            in_stack_fffffffffffffbe4 = *in_RDI;
            in_stack_fffffffffffffbd8 = local_180;
            pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                (in_RDI + 0x1f6),(ulong)local_210);
            pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                               (in_stack_fffffffffffffbd8,(ulong)*pvVar6);
            uVar2 = in_stack_fffffffffffffbe4 - *pvVar4;
            local_214 = uVar2;
            if (uVar2 != 0) {
              in_stack_fffffffffffffbc8 = local_1e0;
              pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                                 ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                  (in_RDI + 0x1f6),(ulong)local_210);
              local_220 = (ulong)*pvVar6;
              in_stack_fffffffffffffbd0 =
                   (VectorUint32 *)
                   PseudoPointD<unsigned_int>::operator[](in_stack_fffffffffffffbc8,&local_220);
              DirectBitEncoder::EncodeLeastSignificantBits32
                        (this_01,SUB84(uVar12,4),(uint32_t)uVar12);
              in_stack_fffffffffffffbc4 = uVar2;
            }
          }
        }
      }
      else {
        local_224 = *in_RDI - local_1cc;
        local_228 = 1 << ((char)local_224 - 1U & 0x1f);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                      *)(in_RDI + 0x1fc),(ulong)(local_170 + 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        iVar10 = local_228;
        pvVar7 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                               *)(in_RDI + 0x1fc),(ulong)(local_170 + 1));
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar7,(ulong)local_184);
        *pvVar6 = *pvVar6 + iVar10;
        local_230 = std::
                    vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                    ::operator[]((vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                  *)(in_RDI + 0x1fc),(ulong)(local_170 + 1));
        uVar2 = local_184;
        local_268 = in_stack_00000008;
        pDStack_260 = in_stack_00000010;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (local_230,(ulong)local_184);
        Splitter::Splitter(local_290,uVar2,*pvVar4);
        __first.vec_ = (PointDVector<unsigned_int> *)in_stack_fffffffffffffbd8;
        __first.item_ = (size_t)in_stack_fffffffffffffbd0;
        __first.dimensionality_ = in_stack_fffffffffffffbe0;
        __first._20_4_ = in_stack_fffffffffffffbe4;
        __last.item_._4_4_ = in_stack_fffffffffffffbec;
        __last.item_._0_4_ = in_stack_fffffffffffffbe8;
        __last.vec_._0_4_ = in_stack_fffffffffffffbf0;
        __last.vec_._4_4_ = in_stack_fffffffffffffbf4;
        __last._16_8_ = pvVar3;
        __pred.value_ = in_stack_fffffffffffffbc4;
        __pred.axis_ = in_stack_fffffffffffffbc0;
        std::
        partition<draco::PointDVector<unsigned_int>::PointDVectorIterator,draco::DynamicIntegerPointsKdTreeEncoder<6>::Splitter>
                  (__first,__last,__pred);
        MostSignificantBit(local_1d0);
        sVar5 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                          (&local_248,(PointDVectorIterator *)&stack0x00000008);
        sVar8 = PointDVector<unsigned_int>::PointDVectorIterator::operator-
                          ((PointDVectorIterator *)&stack0x00000020,&local_248);
        if ((uint)sVar5 != (uint)sVar8) {
          DirectBitEncoder::EncodeBit
                    ((DirectBitEncoder *)pDStack_260,SUB81((ulong)local_268 >> 0x38,0));
        }
        iVar10 = (int)((ulong)local_268 >> 0x20);
        if ((uint)sVar5 < (uint)sVar8) {
          EncodeNumber(pDStack_260,iVar10,(uint32_t)local_268);
        }
        else {
          EncodeNumber(pDStack_260,iVar10,(uint32_t)local_268);
        }
        this_02 = (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   *)(in_RDI + 0x202);
        pvVar7 = std::
                 vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ::operator[](this_02,(ulong)local_170);
        pvVar6 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           (pvVar7,(ulong)local_184);
        *pvVar6 = *pvVar6 + 1;
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](this_02,(ulong)local_170);
        std::
        vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
        ::operator[](this_02,(ulong)(local_170 + 1));
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator=
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffbf4,in_stack_fffffffffffffbf0),
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_fffffffffffffbec,in_stack_fffffffffffffbe8));
        uVar1 = PointDVector<unsigned_int>::PointDVectorIterator::operator!=
                          (&local_248,(PointDVectorIterator *)&stack0x00000008);
        if ((bool)uVar1) {
          begin_.vec_ = local_248.vec_;
          begin_.item_ = local_248.item_;
          begin_.dimensionality_ = local_248.dimensionality_;
          begin_._20_4_ = local_248._20_4_;
          end__00.vec_._6_1_ = in_stack_fffffffffffffb86;
          end__00._0_14_ = in_stack_fffffffffffffb78;
          end__00.vec_._7_1_ = (bool)uVar1;
          end__00._16_8_ = this_02;
          pvVar9 = in_stack_00000008;
          pDVar11 = in_stack_00000010;
          EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
                    ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                     in_stack_00000010,begin_,end__00,(uint32_t)((ulong)in_stack_00000008 >> 0x20),
                     (uint32_t)in_stack_00000008);
          std::
          stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                  *)pDVar11,pvVar9);
        }
        in_stack_fffffffffffffb86 =
             PointDVector<unsigned_int>::PointDVectorIterator::operator!=
                       (&local_248,(PointDVectorIterator *)&stack0x00000020);
        if ((bool)in_stack_fffffffffffffb86) {
          begin__01.vec_ = in_stack_00000028;
          begin__01.item_ = (size_t)in_stack_00000020;
          begin__01.dimensionality_ = uStack0000000000000030;
          begin__01._20_4_ = uStack0000000000000034;
          end__01.vec_._6_1_ = (bool)in_stack_fffffffffffffb86;
          end__01._0_14_ = in_stack_fffffffffffffb78;
          end__01.vec_._7_1_ = uVar1;
          end__01._16_8_ = this_02;
          pvVar9 = (value_type *)local_248.item_;
          this_00 = (EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                    local_248.vec_;
          EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>::EncodingStatus
                    ((EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator> *)
                     local_248.vec_,begin__01,end__01,(uint32_t)(local_248.item_ >> 0x20),
                     (uint32_t)local_248.item_);
          std::
          stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
          ::push((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
                  *)this_00,pvVar9);
        }
      }
    }
  }
  std::
  stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
  ::~stack((stack<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::deque<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>,_std::allocator<draco::DynamicIntegerPointsKdTreeEncoder<6>::EncodingStatus<draco::PointDVector<unsigned_int>::PointDVectorIterator>_>_>_>
            *)0x229dfc);
  return;
}

Assistant:

void DynamicIntegerPointsKdTreeEncoder<compression_level_t>::EncodeInternal(
    RandomAccessIteratorT begin, RandomAccessIteratorT end) {
  typedef EncodingStatus<RandomAccessIteratorT> Status;

  base_stack_[0] = VectorUint32(dimension_, 0);
  levels_stack_[0] = VectorUint32(dimension_, 0);
  Status init_status(begin, end, 0, 0);
  std::stack<Status> status_stack;
  status_stack.push(init_status);

  // TODO(b/199760123): Use preallocated vector instead of stack.
  while (!status_stack.empty()) {
    Status status = status_stack.top();
    status_stack.pop();

    begin = status.begin;
    end = status.end;
    const uint32_t last_axis = status.last_axis;
    const uint32_t stack_pos = status.stack_pos;
    const VectorUint32 &old_base = base_stack_[stack_pos];
    const VectorUint32 &levels = levels_stack_[stack_pos];

    const uint32_t axis =
        GetAndEncodeAxis(begin, end, old_base, levels, last_axis);
    const uint32_t level = levels[axis];
    const uint32_t num_remaining_points = static_cast<uint32_t>(end - begin);

    // If this happens all axis are subdivided to the end.
    if ((bit_length_ - level) == 0) {
      continue;
    }

    // Fast encoding of remaining bits if number of points is 1 or 2.
    // Doing this also for 2 gives a slight additional speed up.
    if (num_remaining_points <= 2) {
      // TODO(b/199760123): |axes_| not necessary, remove would change
      // bitstream!
      axes_[0] = axis;
      for (uint32_t i = 1; i < dimension_; i++) {
        axes_[i] = DRACO_INCREMENT_MOD(axes_[i - 1], dimension_);
      }
      for (uint32_t i = 0; i < num_remaining_points; ++i) {
        const auto &p = *(begin + i);
        for (uint32_t j = 0; j < dimension_; j++) {
          const uint32_t num_remaining_bits = bit_length_ - levels[axes_[j]];
          if (num_remaining_bits) {
            remaining_bits_encoder_.EncodeLeastSignificantBits32(
                num_remaining_bits, p[axes_[j]]);
          }
        }
      }
      continue;
    }

    const uint32_t num_remaining_bits = bit_length_ - level;
    const uint32_t modifier = 1 << (num_remaining_bits - 1);
    base_stack_[stack_pos + 1] = old_base;  // copy
    base_stack_[stack_pos + 1][axis] += modifier;
    const VectorUint32 &new_base = base_stack_[stack_pos + 1];

    const RandomAccessIteratorT split =
        std::partition(begin, end, Splitter(axis, new_base[axis]));

    DRACO_DCHECK_EQ(true, (end - begin) > 0);

    // Encode number of points in first and second half.
    const int required_bits = MostSignificantBit(num_remaining_points);

    const uint32_t first_half = static_cast<uint32_t>(split - begin);
    const uint32_t second_half = static_cast<uint32_t>(end - split);
    const bool left = first_half < second_half;

    if (first_half != second_half) {
      half_encoder_.EncodeBit(left);
    }

    if (left) {
      EncodeNumber(required_bits, num_remaining_points / 2 - first_half);
    } else {
      EncodeNumber(required_bits, num_remaining_points / 2 - second_half);
    }

    levels_stack_[stack_pos][axis] += 1;
    levels_stack_[stack_pos + 1] = levels_stack_[stack_pos];  // copy
    if (split != begin) {
      status_stack.push(Status(begin, split, axis, stack_pos));
    }
    if (split != end) {
      status_stack.push(Status(split, end, axis, stack_pos + 1));
    }
  }
}